

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::OnBrTableTarget(TypeChecker *this,Index depth)

{
  _anonymous_namespace_ *this_00;
  _Alloc_hider _Var1;
  Result RVar2;
  int *prefix;
  bool bVar3;
  int *piVar4;
  _anonymous_namespace_ *this_01;
  bool bVar5;
  Label *label;
  Label *local_70;
  string local_68;
  string local_48;
  
  RVar2 = GetLabel(this,depth,&local_70);
  bVar3 = true;
  bVar5 = bVar3;
  if (RVar2.enum_ != Error) {
    this_01 = (_anonymous_namespace_ *)&local_70->result_types;
    if (local_70->label_type == Loop) {
      this_01 = (_anonymous_namespace_ *)&local_70->param_types;
    }
    RVar2 = CheckSignature(this,(TypeVector *)this_01,"br_table");
    bVar5 = RVar2.enum_ == Error;
    this_00 = (_anonymous_namespace_ *)this->br_table_sig_;
    if (this_00 == (_anonymous_namespace_ *)0x0) {
      this->br_table_sig_ = (TypeVector *)this_01;
    }
    else {
      prefix = *(int **)this_00;
      piVar4 = *(int **)this_01;
      if ((long)*(int **)(this_00 + 8) - (long)prefix == *(long *)(this_01 + 8) - (long)piVar4) {
        for (; prefix != *(int **)(this_00 + 8); prefix = prefix + 1) {
          if (*prefix != *piVar4) goto LAB_0017e23d;
          piVar4 = piVar4 + 1;
        }
      }
      else {
LAB_0017e23d:
        (anonymous_namespace)::TypesToString_abi_cxx11_
                  (&local_48,this_00,(TypeVector *)0x0,(char *)prefix);
        _Var1._M_p = local_48._M_dataplus._M_p;
        (anonymous_namespace)::TypesToString_abi_cxx11_
                  (&local_68,this_01,(TypeVector *)0x0,(char *)prefix);
        PrintError(this,"br_table labels have inconsistent types: expected %s, got %s",_Var1._M_p,
                   local_68._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        bVar5 = bVar3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
      }
    }
  }
  RVar2.enum_._1_3_ = 0;
  RVar2.enum_._0_1_ = bVar5;
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::OnBrTableTarget(Index depth) {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  TypeVector& label_sig = label->br_types();
  result |= CheckSignature(label_sig, "br_table");

  // Make sure this label's signature is consistent with the previous labels'
  // signatures.
  if (br_table_sig_ == nullptr) {
    br_table_sig_ = &label_sig;
  } else {
    if (*br_table_sig_ != label_sig) {
      result |= Result::Error;
      PrintError("br_table labels have inconsistent types: expected %s, got %s",
                 TypesToString(*br_table_sig_).c_str(),
                 TypesToString(label_sig).c_str());
    }
  }

  return result;
}